

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Path * __thiscall kj::Path::append(Path *__return_storage_ptr__,Path *this,Path *suffix)

{
  String *pSVar1;
  size_t sVar2;
  String *pSVar3;
  String *pSVar4;
  String *pSVar5;
  Array<kj::String> *__range1_1;
  Array<kj::String> *__range1;
  
  pSVar3 = (String *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,(suffix->parts).size_ + (this->parts).size_,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  sVar2 = (this->parts).size_;
  pSVar4 = pSVar3;
  if (sVar2 != 0) {
    pSVar5 = (this->parts).ptr;
    pSVar1 = pSVar5 + sVar2;
    do {
      (pSVar4->content).ptr = (pSVar5->content).ptr;
      (pSVar4->content).size_ = (pSVar5->content).size_;
      (pSVar4->content).disposer = (pSVar5->content).disposer;
      (pSVar5->content).ptr = (char *)0x0;
      (pSVar5->content).size_ = 0;
      pSVar4 = pSVar4 + 1;
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar1);
  }
  sVar2 = (suffix->parts).size_;
  if (sVar2 != 0) {
    pSVar5 = (suffix->parts).ptr;
    pSVar1 = pSVar5 + sVar2;
    do {
      (pSVar4->content).ptr = (pSVar5->content).ptr;
      (pSVar4->content).size_ = (pSVar5->content).size_;
      (pSVar4->content).disposer = (pSVar5->content).disposer;
      (pSVar5->content).ptr = (char *)0x0;
      (pSVar5->content).size_ = 0;
      pSVar4 = pSVar4 + 1;
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar1);
  }
  (__return_storage_ptr__->parts).ptr = pSVar3;
  (__return_storage_ptr__->parts).size_ = ((long)pSVar4 - (long)pSVar3 >> 3) * -0x5555555555555555;
  (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

Path Path::append(Path&& suffix) && {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(kj::mv(p));
  for (auto& p: suffix.parts) newParts.add(kj::mv(p));
  return Path(newParts.finish(), ALREADY_CHECKED);
}